

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

Logon * SuiteSessionTests::createFIX40Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  Header *header;
  INT local_104;
  HeartBtInt local_100;
  INT local_8c;
  EncryptMethod local_88;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  Logon *logon;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX40::Logon::Logon(__return_storage_ptr__);
  local_8c = 0;
  FIX::EncryptMethod::EncryptMethod(&local_88,&local_8c);
  FIX40::Logon::set(__return_storage_ptr__,&local_88);
  FIX::EncryptMethod::~EncryptMethod(&local_88);
  local_104 = 0x1e;
  FIX::HeartBtInt::HeartBtInt(&local_100,&local_104);
  FIX40::Logon::set(__return_storage_ptr__,&local_100);
  FIX::HeartBtInt::~HeartBtInt(&local_100);
  header = FIX40::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)header,target_local,pcStack_20,local_24);
  return __return_storage_ptr__;
}

Assistant:

FIX40::Logon createFIX40Logon( const char* sender, const char* target, int seq )
{
  FIX40::Logon logon;
  logon.set( EncryptMethod( 0 ) );
  logon.set( HeartBtInt( 30 ) );
  fillHeader( logon.getHeader(), sender, target, seq );
  return logon;
}